

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::reset(task_impl_base<_1a67ba37_> *this)

{
  shared_future<void> local_18;
  
  ensure_task_not_running(this);
  local_18.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_18.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::shared_future<void>::operator=(&this->future_,&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  LOCK();
  (((this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->canceled_
  )._M_base._M_i = false;
  UNLOCK();
  this->schedule_mode_ = true;
  return;
}

Assistant:

void reset() override {
        ensure_task_not_running();
        future_ = std::shared_future<result_type>();
        transwarp::detail::node_manip::set_canceled(*node_, false);
        schedule_mode_ = true;
    }